

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

bool pbrt::InsidePolkaDot(Point2f st)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  float fVar10;
  undefined1 extraout_var [60];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = st.super_Tuple2<pbrt::Point2,_float>;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar3 = vaddps_avx512vl(auVar8._0_16_,auVar3);
  auVar3 = vroundps_avx(auVar3,9);
  auVar6._0_4_ = (int)auVar3._0_4_;
  auVar6._4_4_ = (int)auVar3._4_4_;
  auVar6._8_4_ = (int)auVar3._8_4_;
  auVar6._12_4_ = (int)auVar3._12_4_;
  auVar3 = vcvtdq2ps_avx(auVar6);
  auVar6 = vmovshdup_avx(auVar3);
  fVar4 = auVar3._0_4_;
  fVar10 = auVar6._0_4_;
  FVar5 = Noise(fVar4 + 0.5,fVar10 + 0.5,0.5);
  if (0.0 < FVar5) {
    FVar5 = Noise(fVar4 + 1.5,fVar10 + 2.8,0.5);
    auVar9._0_4_ = Noise(fVar4 + 4.5,fVar10 + 9.8,0.5);
    auVar9._4_60_ = extraout_var;
    auVar2._4_4_ = extraout_XMM0_Db;
    auVar2._0_4_ = FVar5;
    auVar2._8_4_ = extraout_XMM0_Dc;
    auVar2._12_4_ = extraout_XMM0_Dd;
    auVar6 = vinsertps_avx(auVar2,auVar9._0_16_,0x10);
    auVar1._8_4_ = 0x3e19999a;
    auVar1._0_8_ = 0x3e19999a3e19999a;
    auVar1._12_4_ = 0x3e19999a;
    auVar3 = vfmadd132ps_avx512vl(auVar6,auVar3,auVar1);
    auVar3 = vsubps_avx(auVar8._0_16_,auVar3);
    auVar7._0_4_ = auVar3._0_4_ * auVar3._0_4_;
    auVar7._4_4_ = auVar3._4_4_ * auVar3._4_4_;
    auVar7._8_4_ = auVar3._8_4_ * auVar3._8_4_;
    auVar7._12_4_ = auVar3._12_4_ * auVar3._12_4_;
    auVar3 = vhaddps_avx(auVar7,auVar7);
    if (auVar3._0_4_ < 0.122499995) {
      return true;
    }
  }
  return false;
}

Assistant:

bool InsidePolkaDot(Point2f st) {
    // Compute cell indices (_sCell_,_tCell_ for dots
    int sCell = std::floor(st[0] + .5f), tCell = std::floor(st[1] + .5f);

    if (Noise(sCell + .5f, tCell + .5f) > 0) {
        // Determine dot position and test if _st_ is inside it
        Float radius = .35f;
        Float maxShift = 0.5f - radius;
        Float sCenter = sCell + maxShift * Noise(sCell + 1.5f, tCell + 2.8f);
        Float tCenter = tCell + maxShift * Noise(sCell + 4.5f, tCell + 9.8f);
        Vector2f dst = st - Point2f(sCenter, tCenter);
        if (LengthSquared(dst) < radius * radius)
            return true;
    }
    return false;
}